

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::DiskAppendableFile> __thiscall
kj::heap<kj::(anonymous_namespace)::DiskAppendableFile,kj::AutoCloseFd>
          (kj *this,AutoCloseFd *params)

{
  DiskAppendableFile *this_00;
  AutoCloseFd *fd;
  DiskAppendableFile *extraout_RDX;
  Own<kj::(anonymous_namespace)::DiskAppendableFile> OVar1;
  AutoCloseFd *params_local;
  
  this_00 = (DiskAppendableFile *)operator_new(0x30);
  fd = fwd<kj::AutoCloseFd>(params);
  anon_unknown_8::DiskAppendableFile::DiskAppendableFile(this_00,fd);
  Own<kj::(anonymous_namespace)::DiskAppendableFile>::Own
            ((Own<kj::(anonymous_namespace)::DiskAppendableFile> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile>::instance);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}